

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::escapeString(string *str)

{
  char *pcVar1;
  undefined8 local_18;
  size_type fnd;
  string *str_local;
  
  local_18 = std::__cxx11::string::find_first_of((char *)str,0x1d0e80);
  do {
    if (local_18 == 0xffffffffffffffff) {
      return;
    }
    if (local_18 == 0) {
LAB_0019dcab:
      std::__cxx11::string::insert((ulong)str,local_18,'\x01');
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar1 != '\\') goto LAB_0019dcab;
    }
    local_18 = std::__cxx11::string::find_first_of((char *)str,0x1d0e80);
  } while( true );
}

Assistant:

static void escapeString(std::string& str)
{
    auto fnd = str.find_first_of("{}[]()");
    while (fnd != std::string::npos) {
        if (fnd == 0 || str[fnd - 1] != '\\') {
            str.insert(fnd, 1, '\\');
            ++fnd;
        }
        fnd = str.find_first_of("{}[]()", fnd + 1);
    }
}